

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O3

void __thiscall
TEST_GlobalMemoryAccountant_report_Test::TEST_GlobalMemoryAccountant_report_Test
          (TEST_GlobalMemoryAccountant_report_Test *this)

{
  memset(this,0,0x98);
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalMemoryAccountant_00389eb8;
  GlobalMemoryAccountant::GlobalMemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).accountant);
  TestTestingFixture::TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).fixture);
  ExecFunction::ExecFunction
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).testFunction.
              super_ExecFunction);
  (this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).testFunction.super_ExecFunction.
  _vptr_ExecFunction = (_func_int **)&PTR__ExecFunctionWithoutParameters_00389ef8;
  GlobalMemoryAllocatorStash::GlobalMemoryAllocatorStash
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).stash);
  (this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalMemoryAccountant_00385f80;
  return;
}

Assistant:

TEST(GlobalMemoryAccountant, report)
{
    accountant.start();
    char* memory = new char[185];
    delete [] memory;
    accountant.stop();

    /* Allocation includes memory leak info */
    STRCMP_CONTAINS("1                1                 1", accountant.report().asCharString());
}